

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O2

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::solveLright(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *vec)

{
  uint *puVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  type_conflict5 tVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  cpp_dec_float<50U,_int,_void> *pcVar12;
  int iVar13;
  int *piVar14;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_2;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  int *local_178;
  cpp_dec_float<50U,_int,_void> local_158;
  int *local_118;
  int *local_110;
  pointer local_108;
  ulong local_100;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_f8;
  long local_f0;
  cpp_dec_float<50U,_int,_void> local_e8;
  cpp_dec_float<50U,_int,_void> local_a8;
  cpp_dec_float<50U,_int,_void> local_68;
  
  local_e8.fpclass = cpp_dec_float_finite;
  local_e8.prec_elem = 10;
  local_e8.data._M_elems[0] = 0;
  local_e8.data._M_elems[1] = 0;
  local_e8.data._M_elems[2] = 0;
  local_e8.data._M_elems[3] = 0;
  local_e8.data._M_elems[4] = 0;
  local_e8.data._M_elems[5] = 0;
  local_e8.data._M_elems._24_5_ = 0;
  local_e8.data._M_elems[7]._1_3_ = 0;
  local_e8.data._M_elems._32_5_ = 0;
  local_e8.data._M_elems[9]._1_3_ = 0;
  local_e8.exp = 0;
  local_e8.neg = false;
  local_108 = (this->l).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_110 = (this->l).idx;
  piVar5 = (this->l).row;
  uVar2 = (this->l).firstUpdate;
  uVar11 = 0;
  uVar10 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar10 = uVar11;
  }
  local_118 = (this->l).start;
  local_f8 = this;
  while (uVar11 != uVar10) {
    iVar9 = piVar5[uVar11];
    uVar6 = *(undefined8 *)(vec[iVar9].m_backend.data._M_elems + 8);
    local_e8.data._M_elems._32_5_ = SUB85(uVar6,0);
    local_e8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
    local_e8.data._M_elems._0_8_ = *(undefined8 *)vec[iVar9].m_backend.data._M_elems;
    local_e8.data._M_elems._8_8_ = *(undefined8 *)(vec[iVar9].m_backend.data._M_elems + 2);
    puVar1 = vec[iVar9].m_backend.data._M_elems + 4;
    local_e8.data._M_elems._16_8_ = *(undefined8 *)puVar1;
    uVar6 = *(undefined8 *)(puVar1 + 2);
    local_e8.data._M_elems._24_5_ = SUB85(uVar6,0);
    local_e8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
    local_e8.exp = vec[iVar9].m_backend.exp;
    local_e8.neg = vec[iVar9].m_backend.neg;
    local_e8.fpclass = vec[iVar9].m_backend.fpclass;
    local_e8.prec_elem = vec[iVar9].m_backend.prec_elem;
    local_158.data._M_elems[0] = 0;
    local_158.data._M_elems[1] = 0;
    local_100 = uVar11;
    tVar8 = boost::multiprecision::operator!=
                      ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_e8,(double *)&local_158);
    if (tVar8) {
      local_f0 = (long)local_118[local_100];
      local_178 = local_110 + local_f0;
      pcVar12 = &local_108[local_f0].m_backend;
      for (iVar9 = local_118[local_100 + 1]; (int)local_f0 < iVar9; iVar9 = iVar9 + -1) {
        local_158.fpclass = cpp_dec_float_finite;
        local_158.prec_elem = 10;
        local_158.data._M_elems[0] = 0;
        local_158.data._M_elems[1] = 0;
        local_158.data._M_elems[2] = 0;
        local_158.data._M_elems[3] = 0;
        local_158.data._M_elems[4] = 0;
        local_158.data._M_elems[5] = 0;
        local_158.data._M_elems[6] = 0;
        local_158.data._M_elems[7] = 0;
        local_158.data._M_elems[8] = 0;
        local_158.data._M_elems[9] = 0;
        local_158.exp = 0;
        local_158.neg = false;
        boost::multiprecision::default_ops::
        eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&local_158,&local_e8,pcVar12);
        iVar3 = *local_178;
        local_68.fpclass = cpp_dec_float_finite;
        local_68.prec_elem = 10;
        local_68.data._M_elems[0] = 0;
        local_68.data._M_elems[1] = 0;
        local_68.data._M_elems[2] = 0;
        local_68.data._M_elems[3] = 0;
        local_68.data._M_elems[4] = 0;
        local_68.data._M_elems[5] = 0;
        local_68.data._M_elems._24_5_ = 0;
        local_68.data._M_elems[7]._1_3_ = 0;
        local_68.data._M_elems._32_5_ = 0;
        local_68._37_8_ = 0;
        boost::multiprecision::default_ops::
        eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&local_68,&local_e8,pcVar12);
        local_a8.fpclass = cpp_dec_float_finite;
        local_a8.prec_elem = 10;
        local_a8.data._M_elems[0] = 0;
        local_a8.data._M_elems[1] = 0;
        local_a8.data._M_elems[2] = 0;
        local_a8.data._M_elems[3] = 0;
        local_a8.data._M_elems[4] = 0;
        local_a8.data._M_elems[5] = 0;
        local_a8.data._M_elems._24_5_ = 0;
        local_a8.data._M_elems[7]._1_3_ = 0;
        local_a8.data._M_elems._32_5_ = 0;
        local_a8._37_8_ = 0;
        boost::multiprecision::default_ops::
        eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&local_a8,&vec[iVar3].m_backend,&local_68);
        local_158.fpclass = cpp_dec_float_finite;
        local_158.prec_elem = 10;
        local_158.data._M_elems[0] = 0;
        local_158.data._M_elems[1] = 0;
        local_158.data._M_elems[2] = 0;
        local_158.data._M_elems[3] = 0;
        local_158.data._M_elems[4] = 0;
        local_158.data._M_elems[5] = 0;
        local_158.data._M_elems[6] = 0;
        local_158.data._M_elems[7] = 0;
        local_158.data._M_elems[8] = 0;
        local_158.data._M_elems[9] = 0;
        local_158.exp = 0;
        local_158.neg = false;
        boost::multiprecision::default_ops::
        eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&local_158,&local_e8,pcVar12);
        iVar3 = *local_178;
        local_178 = local_178 + 1;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                  (&vec[iVar3].m_backend,&local_158);
        pcVar12 = pcVar12 + 1;
      }
    }
    uVar11 = local_100 + 1;
  }
  if ((local_f8->l).updateType != 0) {
    iVar9 = (local_f8->l).firstUnused;
    while ((long)uVar10 < (long)iVar9) {
      iVar3 = local_118[uVar10];
      piVar14 = local_110 + iVar3;
      iVar13 = piVar5[uVar10];
      local_158.data._M_elems[0] = vec[iVar13].m_backend.data._M_elems[0];
      local_158.data._M_elems[9] = vec[iVar13].m_backend.data._M_elems[9];
      puVar1 = vec[iVar13].m_backend.data._M_elems + 5;
      uVar6 = *(undefined8 *)puVar1;
      uVar7 = *(undefined8 *)(puVar1 + 2);
      local_158.data._M_elems[5] = (uint)uVar6;
      local_158.data._M_elems[6] = (uint)((ulong)uVar6 >> 0x20);
      local_158.data._M_elems[7] = (uint)uVar7;
      local_158.data._M_elems[8] = (uint)((ulong)uVar7 >> 0x20);
      puVar1 = vec[iVar13].m_backend.data._M_elems + 1;
      uVar6 = *(undefined8 *)puVar1;
      uVar7 = *(undefined8 *)(puVar1 + 2);
      local_158.data._M_elems[1] = (uint)uVar6;
      local_158.data._M_elems[2] = (uint)((ulong)uVar6 >> 0x20);
      local_158.data._M_elems[3] = (uint)uVar7;
      local_158.data._M_elems[4] = (uint)((ulong)uVar7 >> 0x20);
      local_158.exp = vec[iVar13].m_backend.exp;
      local_158.fpclass = vec[iVar13].m_backend.fpclass;
      local_158.prec_elem = vec[iVar13].m_backend.prec_elem;
      local_158.neg =
           (bool)((local_158.data._M_elems[0] != 0 || local_158.fpclass != cpp_dec_float_finite) ^
                 vec[iVar13].m_backend.neg);
      pcVar12 = &local_108[iVar3].m_backend;
      for (iVar13 = local_118[uVar10 + 1]; iVar3 < iVar13; iVar13 = iVar13 + -1) {
        iVar4 = *piVar14;
        piVar14 = piVar14 + 1;
        local_a8.fpclass = cpp_dec_float_finite;
        local_a8.prec_elem = 10;
        local_a8.data._M_elems[0] = 0;
        local_a8.data._M_elems[1] = 0;
        local_a8.data._M_elems[2] = 0;
        local_a8.data._M_elems[3] = 0;
        local_a8.data._M_elems[4] = 0;
        local_a8.data._M_elems[5] = 0;
        local_a8.data._M_elems._24_5_ = 0;
        local_a8.data._M_elems[7]._1_3_ = 0;
        local_a8.data._M_elems._32_5_ = 0;
        local_a8._37_8_ = 0;
        boost::multiprecision::default_ops::
        eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&local_a8,&vec[iVar4].m_backend,pcVar12);
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                  (&local_158,&local_a8);
        pcVar12 = pcVar12 + 1;
      }
      iVar3 = piVar5[uVar10];
      vec[iVar3].m_backend.data._M_elems[0] = local_158.data._M_elems[0];
      puVar1 = vec[iVar3].m_backend.data._M_elems + 1;
      *(ulong *)puVar1 = CONCAT44(local_158.data._M_elems[2],local_158.data._M_elems[1]);
      *(ulong *)(puVar1 + 2) = CONCAT44(local_158.data._M_elems[4],local_158.data._M_elems[3]);
      puVar1 = vec[iVar3].m_backend.data._M_elems + 5;
      *(ulong *)puVar1 = CONCAT44(local_158.data._M_elems[6],local_158.data._M_elems[5]);
      *(ulong *)(puVar1 + 2) = CONCAT44(local_158.data._M_elems[8],local_158.data._M_elems[7]);
      vec[iVar3].m_backend.data._M_elems[9] = local_158.data._M_elems[9];
      vec[iVar3].m_backend.exp = local_158.exp;
      vec[iVar3].m_backend.neg =
           (bool)((local_158.data._M_elems[0] != 0 || local_158.fpclass != cpp_dec_float_finite) ^
                 local_158.neg);
      vec[iVar3].m_backend.fpclass = local_158.fpclass;
      vec[iVar3].m_backend.prec_elem = local_158.prec_elem;
      uVar10 = uVar10 + 1;
    }
  }
  return;
}

Assistant:

void CLUFactor<R>::solveLright(R* vec)
{
   int i, j, k;
   int end;
   R x;
   R* lval, *val;
   int* lrow, *lidx, *idx;
   int* lbeg;

   lval = l.val.data();
   lidx = l.idx;
   lrow = l.row;
   lbeg = l.start;

   end = l.firstUpdate;

   for(i = 0; i < end; ++i)
   {
      if((x = vec[lrow[i]]) != 0.0)
      {
         SPxOut::debug(this, "y{}={}\n", lrow[i], vec[lrow[i]]);

         k = lbeg[i];
         idx = &(lidx[k]);
         val = &(lval[k]);

         for(j = lbeg[i + 1]; j > k; --j)
         {
            SPxOut::debug(this, "                         -> y{} -= {} * {} = {}    -> {}\n", *idx, x, *val,
                          x * (*val), vec[*idx] - x * (*val));
            vec[*idx++] -= x * (*val++);
         }
      }
   }

   if(l.updateType)                      /* Forest-Tomlin Updates */
   {
      SPxOut::debug(this, "performing FT updates...\n");

      end = l.firstUnused;

      for(; i < end; ++i)
      {
         k = lbeg[i];
         idx = &(lidx[k]);
         val = &(lval[k]);
         StableSum<R> tmp(-vec[lrow[i]]);

         for(j = lbeg[i + 1]; j > k; --j)
            tmp += vec[*idx++] * (*val++);

         vec[lrow[i]] = -R(tmp);

         SPxOut::debug(this, "y{}={}\n", lrow[i], vec[lrow[i]]);
      }

      SPxOut::debug(this, "finished FT updates.\n");
   }
}